

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# owning_string_map.hpp
# Opt level: O2

mapped_type * __thiscall
duckdb::
OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
::GetOrCreate(OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
              *this,key_type k)

{
  value_type entry;
  iterator iVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_duckdb::string_t,_unsigned_long>_>,_bool> pVar2;
  anon_union_16_2_67f50693_for_value local_18;
  
  local_18.pointer.ptr = (char *)k.value._8_8_;
  local_18._0_8_ = k.value._0_8_;
  iVar1 = ::std::
          _Rb_tree<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_long>,_std::_Select1st<std::pair<const_duckdb::string_t,_unsigned_long>_>,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>
          ::find(&(this->map)._M_t,(key_type *)&local_18.pointer);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->map)._M_t._M_impl.super__Rb_tree_header) {
    entry.first.value.pointer.ptr = local_18.pointer.ptr;
    entry.first.value._0_8_ = local_18._0_8_;
    entry.second = 0;
    pVar2 = insert(this,entry);
    iVar1._M_node = (_Base_ptr)pVar2.first._M_node;
  }
  return (mapped_type *)&iVar1._M_node[1]._M_left;
}

Assistant:

mapped_type &GetOrCreate(key_type k) {
		auto entry = map.find(k);
		if (entry != map.end()) {
			return entry->second;
		}
		auto result = insert(make_pair(k, mapped_type()));
		return result.first->second;
	}